

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O1

bool iDynTree::CreateModelFromDHChain(DHChain *inputChain,Model *outputModel)

{
  ostream *this;
  pointer pbVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  size_type *psVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  string baseLinkName;
  string previousLinkName;
  string addedLinkName;
  string addedJointName;
  Transform parent_H_child;
  Transform dhTransform;
  RevoluteJoint addedJoint;
  Axis axisOnZThroughOrigin;
  Axis rot_axis_in_parent_frame;
  Link linkDefault;
  SpatialInertia inertiaDefault;
  string local_590;
  Model *local_570;
  string local_568;
  DHChain *local_548;
  string local_540;
  string local_520;
  string local_500 [3];
  long *local_4a0 [2];
  long local_490 [10];
  undefined1 local_440 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [7];
  ios_base local_3c0 [408];
  Axis local_228;
  Axis local_1f8;
  Link local_1c8;
  Transform local_158 [96];
  Transform local_f8 [96];
  SpatialInertia local_98;
  
  Model::Model((Model *)local_440);
  local_570 = outputModel;
  Model::operator=(outputModel,(Model *)local_440);
  Model::~Model((Model *)local_440);
  iDynTree::Position::Zero();
  iDynTree::RotationalInertia::Zero();
  iDynTree::SpatialInertia::SpatialInertia
            (&local_98,1.0,(Position *)&local_1c8,(RotationalInertia *)local_440);
  Link::Link(&local_1c8);
  Link::setInertia(&local_1c8,&local_98);
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"link0","");
  Model::addLink(local_570,&local_590,&local_1c8);
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_568,local_590._M_dataplus._M_p,
             local_590._M_dataplus._M_p + local_590._M_string_length);
  if (*(long *)&inputChain->field_0x68 != *(long *)&inputChain->dhParams) {
    lVar6 = 0x18;
    lVar8 = 8;
    uVar7 = 0;
    local_548 = inputChain;
    do {
      pbVar1 = (local_548->dofNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
      lVar2 = *(long *)((long)pbVar1 + lVar8 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_520,lVar2,
                 *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar8) + lVar2);
      std::__cxx11::stringstream::stringstream((stringstream *)local_440);
      std::ostream::operator<<((ostream *)(local_440 + 0x10),(int)uVar7 + 1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_440);
      std::ios_base::~ios_base(local_3c0);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_500,0,(char *)0x0,0x16f35e);
      local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_540.field_2._M_allocated_capacity = *psVar5;
        local_540.field_2._8_8_ = plVar3[3];
      }
      else {
        local_540.field_2._M_allocated_capacity = *psVar5;
        local_540._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_540._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500[0]._M_dataplus._M_p != &local_500[0].field_2) {
        operator_delete(local_500[0]._M_dataplus._M_p,local_500[0].field_2._M_allocated_capacity + 1
                       );
      }
      iDynTree::Transform::Transform((Transform *)local_500);
      iDynTree::Position::Position(&local_1f8.origin);
      iDynTree::Direction::Direction((Direction *)local_440,0.0,0.0,1.0);
      iDynTree::Position::Zero();
      iDynTree::Axis::Axis(&local_228,(Direction *)local_440,(Position *)local_4a0);
      lVar2 = *(long *)&local_548->dhParams;
      TransformFromDH((iDynTree *)local_4a0,*(double *)(lVar2 + -0x18 + lVar6),
                      *(double *)(lVar2 + -8 + lVar6),*(double *)(lVar2 + -0x10 + lVar6),
                      *(double *)(lVar2 + lVar6));
      iDynTree::Transform::operator=((Transform *)local_500,(Transform *)local_4a0);
      iDynTree::Axis::operator=(&local_1f8,&local_228);
      RevoluteJoint::RevoluteJoint((RevoluteJoint *)local_440,(Transform *)local_500,&local_1f8);
      Model::addJointAndLink
                (local_570,&local_568,&local_520,(IJointConstPtr)local_440,&local_540,&local_1c8);
      std::__cxx11::string::_M_assign((string *)&local_568);
      RevoluteJoint::~RevoluteJoint((RevoluteJoint *)local_440);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540._M_dataplus._M_p != &local_540.field_2) {
        operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
      uVar4 = (*(long *)&local_548->field_0x68 - *(long *)&local_548->dhParams >> 4) *
              -0x5555555555555555;
      lVar6 = lVar6 + 0x30;
      lVar8 = lVar8 + 0x20;
      inputChain = local_548;
    } while (uVar7 <= uVar4 && uVar4 - uVar7 != 0);
  }
  local_440._0_8_ = local_440 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"baseFrame","");
  iDynTree::Transform::inverse();
  Model::addAdditionalFrameToLink(local_570,&local_590,(string *)local_440,local_f8);
  if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
    operator_delete((void *)local_440._0_8_,(ulong)(local_430[0]._M_allocated_capacity + 1));
  }
  lVar6 = *(long *)&inputChain->dhParams;
  lVar8 = *(long *)&inputChain->field_0x68;
  std::__cxx11::stringstream::stringstream((stringstream *)local_440);
  this = (ostream *)(local_440 + 0x10);
  std::ostream::operator<<(this,(int)((ulong)(lVar8 - lVar6) >> 4) * -0x55555555);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_440);
  std::ios_base::~ios_base(local_3c0);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_4a0,0,(char *)0x0,0x16f35e);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_500[0].field_2._0_8_ = *psVar5;
    local_500[0].field_2._8_4_ = (undefined4)plVar3[3];
    local_500[0].field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_500[0]._M_dataplus._M_p = (pointer)&local_500[0].field_2;
  }
  else {
    local_500[0].field_2._0_8_ = *psVar5;
    local_500[0]._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_500[0]._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_440._0_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"distalFrame","");
  iDynTree::Transform::Transform(local_158,&inputChain->HN);
  Model::addAdditionalFrameToLink(local_570,local_500,(string *)local_440,local_158);
  if ((ostream *)local_440._0_8_ != this) {
    operator_delete((void *)local_440._0_8_,(ulong)(local_430[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500[0]._M_dataplus._M_p != &local_500[0].field_2) {
    operator_delete(local_500[0]._M_dataplus._M_p,local_500[0].field_2._M_allocated_capacity + 1);
  }
  if (local_4a0[0] != local_490) {
    operator_delete(local_4a0[0],local_490[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool CreateModelFromDHChain(const DHChain& inputChain,
                                  Model& outputModel)
{
    // First we clear the model
    outputModel = Model();

    // All the inertial will be of one kg in the origin
    iDynTree::SpatialInertia inertiaDefault(1.0,Position::Zero(),RotationalInertia::Zero());
    iDynTree::Link linkDefault;
    linkDefault.setInertia(inertiaDefault);

    std::string baseLinkName  = "link0";


    // Then we create a base link
    outputModel.addLink(baseLinkName,linkDefault);

    std::string previousLinkName = baseLinkName;

    for(int i=0; i<inputChain.getNrOfDOFs(); i++)
    {
        std::string addedJointName = inputChain.getDOFName(i);
        std::string addedLinkName = "link"+intToString(i+1);

        Transform parent_H_child;
        Axis rot_axis_in_parent_frame;
        Axis axisOnZThroughOrigin = Axis(Direction(0.0,0.0,1.0),Position::Zero());
        Transform dhTransform = TransformFromDH(inputChain(i).A,inputChain(i).Alpha,inputChain(i).D,inputChain(i).Offset);
        parent_H_child = dhTransform;
        rot_axis_in_parent_frame = axisOnZThroughOrigin;

        RevoluteJoint addedJoint = RevoluteJoint(parent_H_child,rot_axis_in_parent_frame);
        outputModel.addJointAndLink(previousLinkName,
                                    addedJointName,&(addedJoint),
                                    addedLinkName,linkDefault);

        previousLinkName = addedLinkName;
    }

    // Add base and end effector additional frames, using the H0 and HN information
    outputModel.addAdditionalFrameToLink(baseLinkName,"baseFrame",inputChain.getH0().inverse());
    outputModel.addAdditionalFrameToLink("link"+intToString(inputChain.getNrOfDOFs()),"distalFrame",inputChain.getHN());

    return true;
}